

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

xmlDocPtr parseHtml(xmllintState *lint,char *filename)

{
  xmlParserCtxtPtr pxVar1;
  FILE *__stream;
  long lVar2;
  xmlDocPtr pxVar3;
  size_t sVar4;
  char chars [4096];
  
  pxVar1 = lint->ctxt;
  if (lint->push == 0) {
    if (lint->memory == 0) {
      if ((*filename == '-') && (filename[1] == '\0')) {
        pxVar3 = (xmlDocPtr)htmlCtxtReadFd(pxVar1,0,"-",0,lint->options);
        return pxVar3;
      }
      pxVar3 = (xmlDocPtr)htmlCtxtReadFile(pxVar1,filename,0,lint->options);
      return pxVar3;
    }
    lVar2 = xmlNewInputFromMemory(filename,lint->memoryData,lint->memorySize,6);
    if (lVar2 != 0) {
      pxVar3 = (xmlDocPtr)htmlCtxtParseDocument(pxVar1,lVar2);
      return pxVar3;
    }
    lint->progresult = XMLLINT_ERR_MEM;
    pxVar3 = (xmlDocPtr)0x0;
  }
  else if (((*filename == '-') && (__stream = _stdin, filename[1] == '\0')) ||
          (__stream = fopen64(filename,"rb"), __stream != (FILE *)0x0)) {
    while (sVar4 = fread(chars,1,0x1000,__stream), 0 < (int)sVar4) {
      htmlParseChunk(pxVar1,chars,sVar4 & 0xffffffff,0);
    }
    htmlParseChunk(pxVar1,chars,0,1);
    pxVar3 = pxVar1->myDoc;
    pxVar1->myDoc = (xmlDocPtr)0x0;
    if (__stream != _stdin) {
      fclose(__stream);
    }
  }
  else {
    pxVar3 = (xmlDocPtr)0x0;
    fprintf((FILE *)lint->errStream,"Can\'t open %s\n",filename);
    lint->progresult = XMLLINT_ERR_RDFILE;
  }
  return pxVar3;
}

Assistant:

static xmlDocPtr
parseHtml(xmllintState *lint, const char *filename) {
    xmlParserCtxtPtr ctxt = lint->ctxt;
    xmlDocPtr doc;

#ifdef LIBXML_PUSH_ENABLED
    if (lint->push) {
        FILE *f;
        int res;
        char chars[4096];

        if ((filename[0] == '-') && (filename[1] == 0)) {
            f = stdin;
        } else {
	    f = fopen(filename, "rb");
            if (f == NULL) {
                fprintf(lint->errStream, "Can't open %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                return(NULL);
            }
        }

        while ((res = fread(chars, 1, 4096, f)) > 0) {
            htmlParseChunk(ctxt, chars, res, 0);
        }
        htmlParseChunk(ctxt, chars, 0, 1);
        doc = ctxt->myDoc;
        ctxt->myDoc = NULL;
        if (f != stdin)
            fclose(f);

        return(doc);
    }
#endif /* LIBXML_PUSH_ENABLED */

#if HAVE_DECL_MMAP
    if (lint->memory) {
        xmlParserInputPtr input;

        input = xmlNewInputFromMemory(filename,
                                      lint->memoryData, lint->memorySize,
                                      XML_INPUT_BUF_STATIC |
                                      XML_INPUT_BUF_ZERO_TERMINATED);
        if (input == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            return(NULL);
        }
        doc = htmlCtxtParseDocument(ctxt, input);
        return(doc);
    }
#endif

    if (strcmp(filename, "-") == 0)
        doc = htmlCtxtReadFd(ctxt, STDIN_FILENO, "-", NULL,
                             lint->options);
    else
        doc = htmlCtxtReadFile(ctxt, filename, NULL, lint->options);

    return(doc);
}